

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

string * __thiscall
cmComputeLinkInformation::FeatureDescriptor::GetDecoratedItem
          (string *__return_storage_ptr__,FeatureDescriptor *this,string *library,string *libItem,
          string *linkItem,ItemIsPath isPath)

{
  string *psVar1;
  string format;
  FeaturePlaceHolderExpander expander;
  string sStack_68;
  cmPlaceholderExpander local_48;
  string *local_40;
  string *local_38;
  string *local_30;
  
  std::__cxx11::string::string
            ((string *)&sStack_68,(string *)(&this->ItemPathFormat + (isPath != Yes)));
  local_48._vptr_cmPlaceholderExpander = (_func_int **)&PTR__cmPlaceholderExpander_008a15b8;
  local_40 = library;
  local_38 = libItem;
  local_30 = linkItem;
  psVar1 = cmPlaceholderExpander::ExpandVariables(&local_48,&sStack_68);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)&sStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::FeatureDescriptor::GetDecoratedItem(
  std::string const& library, std::string const& libItem,
  std::string const& linkItem, ItemIsPath isPath) const
{
  auto format =
    isPath == ItemIsPath::Yes ? this->ItemPathFormat : this->ItemNameFormat;

  // replace <LIBRARY>, <LIB_ITEM> and <LINK_ITEM> patterns
  FeaturePlaceHolderExpander expander(&library, &libItem, &linkItem);
  return expander.ExpandVariables(format);
}